

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O2

duckdb_fsst_decoder_t *
duckdb_fsst_decoder(duckdb_fsst_decoder_t *__return_storage_ptr__,duckdb_fsst_encoder_t *encoder)

{
  u8 buf [2304];
  u8 auStack_918 [2312];
  
  duckdb_fsst_export(encoder,auStack_918);
  duckdb_fsst_import(__return_storage_ptr__,auStack_918);
  return __return_storage_ptr__;
}

Assistant:

duckdb_fsst_decoder_t duckdb_fsst_decoder(duckdb_fsst_encoder_t *encoder) {
	u8 buf[sizeof(duckdb_fsst_decoder_t)];
	u32 cnt1 = duckdb_fsst_export(encoder, buf);
	duckdb_fsst_decoder_t decoder;
	u32 cnt2 = duckdb_fsst_import(&decoder, buf);
	assert(cnt1 == cnt2); (void) cnt1; (void) cnt2;
	return decoder;
}